

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
::delete_leaf_node(btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                   *this,node_type *node)

{
  byte bVar1;
  allocator_type *alloc;
  size_type sz;
  node_type *node_local;
  btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *this_local;
  
  alloc = mutable_allocator(this);
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  ::destroy(node,alloc);
  bVar1 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
          ::max_count(node);
  sz = btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
       ::LeafSize((uint)bVar1);
  deallocate(this,sz,node);
  return;
}

Assistant:

void delete_leaf_node(node_type *node) {
            node->destroy(mutable_allocator());
            deallocate(node_type::LeafSize(node->max_count()), node);
        }